

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_transform.cc
# Opt level: O0

unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> __thiscall
draco::AttributeTransform::InitTransformedAttribute
          (AttributeTransform *this,PointAttribute *src_attribute,int num_entries)

{
  int iVar1;
  DataType dt_00;
  Type TVar2;
  int32_t iVar3;
  uint32_t id;
  GeometryAttribute *in_RDX;
  pointer pPVar4;
  long *in_RSI;
  PointAttribute *in_RDI;
  GeometryAttribute ga;
  DataType dt;
  int num_components;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
  *transformed_attribute;
  GeometryAttribute *in_stack_ffffffffffffff30;
  unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *this_00;
  undefined8 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  _Head_base<0UL,_draco::PointAttribute_*,_false> this_01;
  undefined4 in_stack_ffffffffffffff60;
  
  this_01._M_head_impl = in_RDI;
  iVar1 = (**(code **)(*in_RSI + 0x58))(in_RSI,in_RDX);
  dt_00 = (**(code **)(*in_RSI + 0x50))(in_RSI,in_RDX);
  GeometryAttribute::GeometryAttribute(in_stack_ffffffffffffff30);
  TVar2 = GeometryAttribute::attribute_type(in_RDX);
  iVar3 = DataTypeLength(dt_00);
  pPVar4 = (pointer)(long)(iVar1 * iVar3);
  this_00 = (unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)0x0;
  GeometryAttribute::Init
            (&(this_01._M_head_impl)->super_GeometryAttribute,(Type)((ulong)in_RDI >> 0x20),
             (DataBuffer *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (uint8_t)((ulong)in_stack_ffffffffffffff38 >> 0x38),(DataType)in_stack_ffffffffffffff38
             ,false,CONCAT44(TVar2,in_stack_ffffffffffffff60),CONCAT44(iVar1,dt_00));
  operator_new(0x70);
  PointAttribute::PointAttribute(this_01._M_head_impl,&in_RDI->super_GeometryAttribute);
  std::unique_ptr<draco::PointAttribute,std::default_delete<draco::PointAttribute>>::
  unique_ptr<std::default_delete<draco::PointAttribute>,void>(this_00,pPVar4);
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::operator->
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             0x2a3da7);
  PointAttribute::Reset
            ((PointAttribute *)CONCAT44(iVar1,dt_00),CONCAT44(TVar2,in_stack_ffffffffffffff60));
  std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::operator->
            ((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> *)
             0x2a3dc3);
  PointAttribute::SetIdentityMapping((PointAttribute *)0x2a3dcb);
  pPVar4 = std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>::
           operator->((unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                       *)0x2a3dd7);
  id = GeometryAttribute::unique_id(in_RDX);
  GeometryAttribute::set_unique_id(&pPVar4->super_GeometryAttribute,id);
  return (__uniq_ptr_data<draco::PointAttribute,_std::default_delete<draco::PointAttribute>,_true,_true>
          )(tuple<draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>)
           this_01._M_head_impl;
}

Assistant:

std::unique_ptr<PointAttribute> AttributeTransform::InitTransformedAttribute(
    const PointAttribute &src_attribute, int num_entries) {
  const int num_components = GetTransformedNumComponents(src_attribute);
  const DataType dt = GetTransformedDataType(src_attribute);
  GeometryAttribute ga;
  ga.Init(src_attribute.attribute_type(), nullptr, num_components, dt, false,
          num_components * DataTypeLength(dt), 0);
  std::unique_ptr<PointAttribute> transformed_attribute(new PointAttribute(ga));
  transformed_attribute->Reset(num_entries);
  transformed_attribute->SetIdentityMapping();
  transformed_attribute->set_unique_id(src_attribute.unique_id());
  return transformed_attribute;
}